

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O3

size_t bssl::tls_seal_scatter_prefix_len(SSL *ssl,uint8_t type,size_t in_len)

{
  bool bVar1;
  size_t sVar2;
  undefined3 in_register_00000031;
  
  if ((1 < in_len && CONCAT31(in_register_00000031,type) == 0x17) &&
     (bVar1 = ssl_needs_record_splitting(ssl), bVar1)) {
    sVar2 = ssl_cipher_get_record_split_len
                      (((ssl->s3->aead_write_ctx)._M_t.
                        super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_)
    ;
    return sVar2 + 9;
  }
  sVar2 = SSLAEADContext::ExplicitNonceLen
                    ((ssl->s3->aead_write_ctx)._M_t.
                     super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl);
  return sVar2 + 5;
}

Assistant:

static size_t tls_seal_scatter_prefix_len(const SSL *ssl, uint8_t type,
                                          size_t in_len) {
  size_t ret = SSL3_RT_HEADER_LENGTH;
  if (type == SSL3_RT_APPLICATION_DATA && in_len > 1 &&
      ssl_needs_record_splitting(ssl)) {
    // In the case of record splitting, the 1-byte record (of the 1/n-1 split)
    // will be placed in the prefix, as will four of the five bytes of the
    // record header for the main record. The final byte will replace the first
    // byte of the plaintext that was used in the small record.
    ret += ssl_cipher_get_record_split_len(ssl->s3->aead_write_ctx->cipher());
    ret += SSL3_RT_HEADER_LENGTH - 1;
  } else {
    ret += ssl->s3->aead_write_ctx->ExplicitNonceLen();
  }
  return ret;
}